

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  slot_type *psVar5;
  undefined8 uVar6;
  slot_type *psVar7;
  undefined1 auVar8 [16];
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  unsigned_long uVar24;
  unsigned_long uVar25;
  unsigned_long uVar26;
  ctrl_t *pcVar27;
  size_t i;
  ulong uVar28;
  ulong uVar29;
  byte bVar30;
  size_t i_00;
  FindInfo FVar31;
  
  uVar3 = this->capacity_;
  if (uVar3 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x1d5,"size_t phmap::container_internal::CapacityToGrowth(size_t)");
  }
  if (uVar3 - (uVar3 >> 3) >> 1 < this->size_) {
    resize(this,uVar3 * 2 + 1);
    return;
  }
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x748,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x749,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x1bd,
                  "void phmap::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar27 = pcVar4 + uVar3;
  if (pcVar27 + 1 != pcVar4) {
    uVar29 = 0;
    do {
      pcVar1 = pcVar4 + uVar29;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar29);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      uVar29 = uVar29 + 0x10;
    } while (uVar3 + 1 != uVar29);
  }
  uVar6 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar27 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar27 + 9) = uVar6;
  *pcVar27 = -1;
  if (this->capacity_ != 0) {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = this->slots_[i_00].value.first;
        uVar29 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar8,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar8,0);
        FVar31 = find_first_non_full(this,uVar29);
        i = FVar31.offset;
        uVar3 = this->capacity_;
        if ((uVar3 + 1 & uVar3) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x43,
                        "phmap::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar28 = uVar29 >> 7 & uVar3;
        bVar30 = (byte)uVar29;
        if (((i_00 - uVar28 ^ i - uVar28) & uVar3) < 0x10) {
          bVar30 = bVar30 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar30 & 0x7f);
            psVar5 = this->slots_;
            uVar6 = *(undefined8 *)((long)psVar5 + i_00 * 0x18 + 0x10);
            uVar24 = psVar5[i_00].value.first;
            uVar25 = psVar5[i_00].value.second.first;
            uVar26 = psVar5[i].value.second.first;
            psVar5[i_00].value.first = psVar5[i].value.first;
            psVar5[i_00].value.second.first = uVar26;
            *(undefined8 *)((long)psVar5 + i_00 * 0x18 + 0x10) =
                 *(undefined8 *)((long)psVar5 + i * 0x18 + 0x10);
            psVar7 = this->slots_;
            psVar5 = psVar7 + i;
            (psVar5->value).first = uVar24;
            (psVar5->value).second.first = uVar25;
            *(undefined8 *)((long)psVar7 + i * 0x18 + 0x10) = uVar6;
            i_00 = i_00 - 1;
            goto LAB_0010d1f7;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x779,
                          "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>]"
                         );
          }
          set_ctrl(this,i,bVar30 & 0x7f);
          psVar5 = this->slots_;
          *(undefined8 *)((long)psVar5 + i * 0x18 + 0x10) =
               *(undefined8 *)((long)psVar5 + i_00 * 0x18 + 0x10);
          uVar24 = psVar5[i_00].value.second.first;
          psVar5[i].value.first = psVar5[i_00].value.first;
          psVar5[i].value.second.first = uVar24;
          bVar30 = 0x80;
        }
        set_ctrl(this,i_00,bVar30);
      }
LAB_0010d1f7:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }